

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

_Bool askfor_aux(char *buf,size_t len,
                _func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *keypress_h)

{
  unkuint9 Var1;
  undefined5 uVar3;
  keypress kVar2;
  ui_event_type local_60;
  _Bool local_46;
  _Bool local_45;
  _Bool firsttime;
  undefined8 uStack_44;
  _Bool done;
  keypress ch;
  size_t nul;
  size_t k;
  wchar_t x;
  wchar_t y;
  _func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *keypress_h_local;
  size_t len_local;
  char *buf_local;
  
  nul = 0;
  ch.code = 0;
  ch.mods = '\0';
  ch._9_3_ = 0;
  _x = keypress_h;
  keypress_h_local = (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)len;
  len_local = (size_t)buf;
  memset(&stack0xffffffffffffffbc,0,0xc);
  local_45 = false;
  local_46 = true;
  if (_x == (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0) {
    _x = askfor_aux_keypress;
  }
  Term_locate((int *)&k,(int *)((long)&k + 4));
  if (((wchar_t)k < L'\0') || (L'O' < (wchar_t)k)) {
    k._0_4_ = L'\0';
  }
  if ((_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x50 <
      keypress_h_local + (wchar_t)k) {
    keypress_h_local =
         (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)
         (long)(0x50 - (wchar_t)k);
  }
  keypress_h_local[len_local - 1] =
       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool)0x0;
  ch._4_8_ = strlen((char *)len_local);
  Term_erase((wchar_t)k,k._4_4_,(wchar_t)keypress_h_local);
  Term_putstr((wchar_t)k,k._4_4_,L'\xffffffff',L'\v',(char *)len_local);
  while (((local_45 ^ 0xffU) & 1) != 0) {
    Term_gotoxy((wchar_t)k + (int)nul,k._4_4_);
    kVar2 = inkey();
    uStack_44 = kVar2._0_8_;
    local_60 = CONCAT31(local_60._1_3_,kVar2.mods);
    ch.type = local_60;
    Var1 = kVar2._0_9_;
    kVar2._9_3_ = 0;
    kVar2.type = (int)Var1;
    register0x00000084 = (int)(Var1 >> 0x20);
    register0x00000088 = (char)(Var1 >> 0x40);
    local_45 = (*_x)((char *)len_local,(size_t)keypress_h_local,&nul,(size_t *)&ch.code,kVar2,
                     local_46);
    Term_erase((wchar_t)k,k._4_4_,(wchar_t)keypress_h_local);
    Term_putstr((wchar_t)k,k._4_4_,L'\xffffffff',L'\x01',(char *)len_local);
    local_46 = false;
  }
  return uStack_44._4_4_ != 0xe000;
}

Assistant:

bool askfor_aux(char *buf, size_t len, bool (*keypress_h)(char *, size_t, size_t *, size_t *, struct keypress, bool))
{
	int y, x;

	size_t k = 0;		/* Cursor position */
	size_t nul = 0;		/* Position of the null byte in the string */

	struct keypress ch = KEYPRESS_NULL;

	bool done = false;
	bool firsttime = true;

	if (keypress_h == NULL)
		keypress_h = askfor_aux_keypress;

	/* Locate the cursor */
	Term_locate(&x, &y);

	/* Paranoia */
	if ((x < 0) || (x >= 80)) x = 0;

	/* Restrict the length */
	if (x + len > 80) len = 80 - x;

	/* Truncate the default entry */
	buf[len-1] = '\0';

	/* Get the position of the null byte */
	nul = strlen(buf);

	/* Display the default answer */
	Term_erase(x, y, (int)len);
	Term_putstr(x, y, -1, COLOUR_YELLOW, buf);

	/* Process input */
	while (!done) {
		/* Place cursor */
		Term_gotoxy(x + k, y);

		/* Get a key */
		ch = inkey();

		/* Let the keypress handler deal with the keypress */
		done = keypress_h(buf, len, &k, &nul, ch, firsttime);

		/* Update the entry */
		Term_erase(x, y, (int)len);
		Term_putstr(x, y, -1, COLOUR_WHITE, buf);

		/* Not the first time round anymore */
		firsttime = false;
	}

	/* Done */
	return (ch.code != ESCAPE);
}